

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O2

Pdr_Man_t * Pdr_ManStart(Aig_Man_t *pAig,Pdr_Par_t *pPars,Vec_Int_t *vPrioInit)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Pdr_Man_t *pMan;
  Gia_Man_t *p;
  Vec_Ptr_t *pVVar4;
  Vec_Vec_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  Cnf_Man_t *pCVar9;
  Txs3_Man_t *pTVar10;
  uint *puVar11;
  abctime *paVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  
  pMan = (Pdr_Man_t *)calloc(1,0x1d0);
  pMan->pPars = pPars;
  pMan->pAig = pAig;
  if (((pPars->fFlopPrio == 0) && (pPars->fNewXSim == 0)) && (pPars->fUseAbs == 0)) {
    p = (Gia_Man_t *)0x0;
  }
  else {
    p = Gia_ManFromAigSimple(pAig);
  }
  pMan->pGia = p;
  pVVar4 = Vec_PtrAlloc(0);
  pMan->vSolvers = pVVar4;
  pVVar5 = (Vec_Vec_t *)calloc(1,0x10);
  pMan->vClauses = pVVar5;
  piVar6 = (int *)malloc((long)pAig->nRegs << 2);
  pMan->pOrder = piVar6;
  pVVar7 = Vec_IntAlloc(0x100);
  pMan->vActVars = pVVar7;
  if (pPars->fMonoCnf == 0) {
    iVar2 = Aig_ManLevels(pAig);
    iVar15 = 1;
    if (1 < iVar2) {
      iVar15 = iVar2;
    }
    pVVar8 = Vec_WecStart(iVar15 + 1);
    pMan->vVLits = pVVar8;
  }
  uVar1 = pAig->nRegs;
  uVar3 = uVar1;
  if (1 < uVar1) {
    uVar3 = 0;
    for (uVar13 = uVar1 - 1; uVar13 != 0; uVar13 = uVar13 >> 1) {
      uVar3 = uVar3 + 1;
    }
  }
  pMan->nPrioShift = uVar3;
  if (vPrioInit == (Vec_Int_t *)0x0) {
    if (pPars->fFlopPrio == 0) {
      vPrioInit = Vec_IntStart(uVar1);
    }
    else {
      vPrioInit = Pdr_ManDeriveFlopPriorities2(p,1);
    }
    pMan->vPrio = vPrioInit;
  }
  else {
    pMan->vPrio = vPrioInit;
  }
  pVVar7 = Vec_IntAlloc(100);
  pMan->vLits = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vCiObjs = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vCoObjs = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vCiVals = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vCoVals = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vNodes = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vUndo = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vVisits = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vCi2Rem = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pMan->vRes = pVVar7;
  pTVar10 = (Txs3_Man_t *)0x0;
  pCVar9 = Cnf_ManStart();
  pMan->pCnfMan = pCVar9;
  if (pPars->fNewXSim != 0) {
    pTVar10 = Txs3_ManStart(pMan,pAig,vPrioInit);
  }
  pMan->pTxs3 = pTVar10;
  if (pAig->pFanData == (int *)0x0) {
    Aig_ManFanoutStart(pAig);
  }
  if (pAig->pTerSimData == (uint *)0x0) {
    puVar11 = (uint *)calloc((long)(pAig->vObjs->nSize / 0x10 + 1),4);
    pAig->pTerSimData = puVar11;
  }
  iVar15 = pPars->nTimeOutOne;
  if ((long)iVar15 != 0) {
    uVar1 = pAig->nTruePos;
    paVar12 = (abctime *)malloc((long)(int)uVar1 << 3);
    pMan->pTime4Outs = paVar12;
    uVar14 = 0;
    uVar16 = 0;
    if (0 < (int)uVar1) {
      uVar16 = (ulong)uVar1;
    }
    for (; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      paVar12[uVar14] = (long)iVar15 * 1000 + 1;
    }
  }
  if (pPars->fSolveAll != 0) {
    iVar15 = pMan->pAig->nTruePos;
    pVVar4 = Vec_PtrAlloc(iVar15);
    pVVar4->nSize = iVar15;
    memset(pVVar4->pArray,0,(long)iVar15 << 3);
    pMan->vCexes = pVVar4;
    pVVar7 = Vec_IntAlloc(pAig->nTruePos);
    pMan->pPars->vOutMap = pVVar7;
    Vec_IntFill(pVVar7,pAig->nTruePos,-2);
  }
  return pMan;
}

Assistant:

Pdr_Man_t * Pdr_ManStart( Aig_Man_t * pAig, Pdr_Par_t * pPars, Vec_Int_t * vPrioInit )
{
    Pdr_Man_t * p;
    p = ABC_CALLOC( Pdr_Man_t, 1 );
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->pGia     = (pPars->fFlopPrio || p->pPars->fNewXSim || p->pPars->fUseAbs) ? Gia_ManFromAigSimple(pAig) : NULL;
    p->vSolvers = Vec_PtrAlloc( 0 );
    p->vClauses = Vec_VecAlloc( 0 );
    p->pQueue   = NULL;
    p->pOrder   = ABC_ALLOC( int, Aig_ManRegNum(pAig) );
    p->vActVars = Vec_IntAlloc( 256 );
    if ( !p->pPars->fMonoCnf )
        p->vVLits   = Vec_WecStart( 1+Abc_MaxInt(1, Aig_ManLevels(pAig)) );
    // internal use
    p->nPrioShift = Abc_Base2Log(Aig_ManRegNum(pAig));
    if ( vPrioInit )
        p->vPrio = vPrioInit;
    else if ( pPars->fFlopPrio )
        p->vPrio = Pdr_ManDeriveFlopPriorities2(p->pGia, 1);
//    else if ( p->pPars->fNewXSim )
//        p->vPrio = Vec_IntStartNatural( Aig_ManRegNum(pAig) );
    else 
        p->vPrio = Vec_IntStart( Aig_ManRegNum(pAig) );
    p->vLits    = Vec_IntAlloc( 100 );  // array of literals
    p->vCiObjs  = Vec_IntAlloc( 100 );  // cone leaves
    p->vCoObjs  = Vec_IntAlloc( 100 );  // cone roots
    p->vCiVals  = Vec_IntAlloc( 100 );  // cone leaf values
    p->vCoVals  = Vec_IntAlloc( 100 );  // cone root values
    p->vNodes   = Vec_IntAlloc( 100 );  // cone nodes
    p->vUndo    = Vec_IntAlloc( 100 );  // cone undos
    p->vVisits  = Vec_IntAlloc( 100 );  // intermediate
    p->vCi2Rem  = Vec_IntAlloc( 100 );  // CIs to be removed
    p->vRes     = Vec_IntAlloc( 100 );  // final result
    p->pCnfMan  = Cnf_ManStart();
    // ternary simulation
    p->pTxs3    = pPars->fNewXSim ? Txs3_ManStart( p, pAig, p->vPrio ) : NULL;
    // additional AIG data-members
    if ( pAig->pFanData == NULL )
        Aig_ManFanoutStart( pAig );
    if ( pAig->pTerSimData == NULL )
        pAig->pTerSimData = ABC_CALLOC( unsigned, 1 + (Aig_ManObjNumMax(pAig) / 16) );
    // time spent on each outputs
    if ( pPars->nTimeOutOne )
    {
        int i;
        p->pTime4Outs = ABC_ALLOC( abctime, Saig_ManPoNum(pAig) );
        for ( i = 0; i < Saig_ManPoNum(pAig); i++ )
            p->pTime4Outs[i] = pPars->nTimeOutOne * CLOCKS_PER_SEC / 1000 + 1;
    }
    if ( pPars->fSolveAll )
    {
        p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        p->pPars->vOutMap = Vec_IntAlloc( Saig_ManPoNum(pAig) );
        Vec_IntFill( p->pPars->vOutMap, Saig_ManPoNum(pAig), -2 );
    }
    return p;
}